

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.cpp
# Opt level: O0

string_t duckdb::BarScalarFunction(double x,double min,double max,double max_width,string *result)

{
  bool bVar1;
  int iVar2;
  OutOfRangeException *pOVar3;
  ulong uVar4;
  string *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  idx_t integer_max_width;
  idx_t remaining;
  idx_t i;
  idx_t full_blocks_count;
  uint width_as_int;
  idx_t used_blocks;
  double width;
  string *in_stack_fffffffffffffe68;
  string_t *in_stack_fffffffffffffe70;
  allocator *paVar5;
  allocator local_141;
  string local_140 [32];
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  uint local_fc;
  ulong local_f8;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  double local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [38];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [48];
  string *local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  anon_union_16_2_67f50693_for_value local_10;
  
  local_38 = in_RDI;
  local_30 = in_XMM3_Qa;
  local_28 = in_XMM2_Qa;
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  if ((BarScalarFunction(double,double,double,double,std::__cxx11::string&)::FULL_BLOCK == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)
                                   ::FULL_BLOCK), iVar2 != 0)) {
    BarScalarFunction::FULL_BLOCK = UnicodeBar::FullBlock();
    __cxa_guard_release(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)::
                         FULL_BLOCK);
  }
  if ((BarScalarFunction(double,double,double,double,std::__cxx11::string&)::PARTIAL_BLOCKS == '\0')
     && (iVar2 = __cxa_guard_acquire(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)
                                      ::PARTIAL_BLOCKS), iVar2 != 0)) {
    BarScalarFunction::PARTIAL_BLOCKS = UnicodeBar::PartialBlocks();
    __cxa_guard_release(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)::
                         PARTIAL_BLOCKS);
  }
  bVar1 = duckdb::Value::IsFinite<double>(local_30);
  if (!bVar1) {
    local_6a = 1;
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Max bar width must not be NaN or infinity",&local_69);
    duckdb::OutOfRangeException::OutOfRangeException(pOVar3,local_68);
    local_6a = 0;
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if (local_30 < 1.0) {
    local_92 = 1;
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Max bar width must be >= 1",&local_91);
    duckdb::OutOfRangeException::OutOfRangeException(pOVar3,local_90);
    local_92 = 0;
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if (local_30 <= 1000.0) {
    bVar1 = duckdb::Value::IsNan<double>(local_18);
    if ((((bVar1) || (bVar1 = duckdb::Value::IsNan<double>(local_20), bVar1)) ||
        (bVar1 = duckdb::Value::IsNan<double>(local_28), bVar1)) || (local_18 <= local_20)) {
      local_c8 = 0.0;
    }
    else if (local_18 < local_28) {
      local_c8 = (local_30 * (local_18 - local_20)) / (local_28 - local_20);
    }
    else {
      local_c8 = local_30;
    }
    bVar1 = duckdb::Value::IsFinite<double>(local_c8);
    if (bVar1) {
      std::__cxx11::string::clear();
      local_f8 = 0;
      local_fc = LossyNumericCast<unsigned_int,double>(local_c8 * 8.0);
      local_108 = (ulong)(local_fc >> 3);
      for (local_110 = 0; local_110 < local_108; local_110 = local_110 + 1) {
        local_f8 = local_f8 + 1;
        std::__cxx11::string::operator+=(local_38,BarScalarFunction::FULL_BLOCK);
      }
      local_118 = (ulong)local_fc & 7;
      if ((local_fc & 7) != 0) {
        local_f8 = local_f8 + 1;
        std::__cxx11::string::operator+=(local_38,BarScalarFunction::PARTIAL_BLOCKS[local_118]);
      }
      local_120 = (long)local_30 | (long)(local_30 - 9.223372036854776e+18) & (long)local_30 >> 0x3f
      ;
      if (local_f8 < local_120) {
        uVar4 = local_120 - local_f8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,uVar4,' ',&local_141);
        std::__cxx11::string::operator+=(local_38,local_140);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
      }
      string_t::string_t(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      return (anon_union_16_2_67f50693_for_value)
             (anon_union_16_2_67f50693_for_value)local_10.pointer;
    }
    local_ea = 1;
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    paVar5 = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Bar width must not be NaN or infinity",paVar5);
    duckdb::OutOfRangeException::OutOfRangeException(pOVar3,local_e8);
    local_ea = 0;
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  local_ba = 1;
  pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Max bar width must be <= 1000",&local_b9);
  duckdb::OutOfRangeException::OutOfRangeException(pOVar3,local_b8);
  local_ba = 0;
  __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
}

Assistant:

static string_t BarScalarFunction(double x, double min, double max, double max_width, string &result) {
	static const char *FULL_BLOCK = UnicodeBar::FullBlock();
	static const char *const *PARTIAL_BLOCKS = UnicodeBar::PartialBlocks();
	static const idx_t PARTIAL_BLOCKS_COUNT = UnicodeBar::PartialBlocksCount();

	if (!Value::IsFinite(max_width)) {
		throw OutOfRangeException("Max bar width must not be NaN or infinity");
	}
	if (max_width < 1) {
		throw OutOfRangeException("Max bar width must be >= 1");
	}
	if (max_width > 1000) {
		throw OutOfRangeException("Max bar width must be <= 1000");
	}

	double width;

	if (Value::IsNan(x) || Value::IsNan(min) || Value::IsNan(max) || x <= min) {
		width = 0;
	} else if (x >= max) {
		width = max_width;
	} else {
		width = max_width * (x - min) / (max - min);
	}

	if (!Value::IsFinite(width)) {
		throw OutOfRangeException("Bar width must not be NaN or infinity");
	}

	result.clear();
	idx_t used_blocks = 0;

	auto width_as_int = LossyNumericCast<uint32_t>(width * PARTIAL_BLOCKS_COUNT);
	idx_t full_blocks_count = (width_as_int / PARTIAL_BLOCKS_COUNT);
	for (idx_t i = 0; i < full_blocks_count; i++) {
		used_blocks++;
		result += FULL_BLOCK;
	}

	idx_t remaining = width_as_int % PARTIAL_BLOCKS_COUNT;

	if (remaining) {
		used_blocks++;
		result += PARTIAL_BLOCKS[remaining];
	}

	const idx_t integer_max_width = (idx_t)max_width;
	if (used_blocks < integer_max_width) {
		result += std::string(integer_max_width - used_blocks, ' ');
	}
	return string_t(result);
}